

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O2

bool tcu::isLookupResultValid
               (Texture1DArrayView *texture,Sampler *sampler,LookupPrecision *prec,Vec2 *coord,
               Vec2 *lodBounds,Vec4 *result)

{
  float coordX;
  float fVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  FilterMode FVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int level;
  int iVar12;
  float fVar13;
  undefined1 auVar14 [16];
  float __x;
  float __x_00;
  Vec2 local_40;
  IVec2 layerRange;
  
  iVar11 = 0;
  if (0 < texture->m_numLevels) {
    iVar11 = (texture->m_levels->m_size).m_data[1];
  }
  computeLayerRange((tcu *)&layerRange,iVar11,(prec->coordBits).m_data[1],coord->m_data[1]);
  coordX = coord->m_data[0];
  __x = (float)*(undefined8 *)lodBounds->m_data;
  __x_00 = (float)((ulong)*(undefined8 *)lodBounds->m_data >> 0x20);
  fVar1 = sampler->lodThreshold;
  fVar13 = ceilf(__x + 0.5);
  iVar3 = (int)fVar13 + -1;
  fVar13 = floorf(__x_00 + 0.5);
  iVar4 = (int)fVar13;
  fVar13 = floorf(__x);
  iVar5 = (int)fVar13;
  fVar13 = floorf(__x_00);
  iVar6 = (int)fVar13;
  iVar11 = layerRange.m_data[0];
  while ((iVar11 <= layerRange.m_data[1] &&
         ((fVar1 < __x ||
          (bVar2 = isLevelSampleResultValid
                             (texture->m_levels,sampler,sampler->magFilter,prec,coordX,iVar11,result
                             ), !bVar2))))) {
    if (fVar1 < __x_00) {
      FVar8 = sampler->minFilter;
      iVar10 = texture->m_numLevels + -1;
      if (iVar10 < 1 || (FVar8 - NEAREST_MIPMAP_LINEAR & 0xfffffffd) != 0) {
        if ((FVar8 == LINEAR_MIPMAP_NEAREST) || (FVar8 == NEAREST_MIPMAP_NEAREST)) {
          iVar12 = iVar10;
          if (iVar3 < iVar10) {
            iVar12 = iVar3;
          }
          if (iVar3 < 0) {
            iVar12 = 0;
          }
          if (iVar4 < iVar10) {
            iVar10 = iVar4;
          }
          if (iVar4 < 0) {
            iVar10 = 0;
          }
          while (iVar12 <= iVar10) {
            uVar7 = sampler->minFilter - LINEAR;
            FVar8 = NEAREST;
            if (uVar7 < 5) {
              FVar8 = *(FilterMode *)(&DAT_00a04ed0 + (ulong)uVar7 * 4);
            }
            bVar2 = isLevelSampleResultValid
                              (texture->m_levels + iVar12,sampler,FVar8,prec,coordX,iVar11,result);
            iVar12 = iVar12 + 1;
            if (bVar2) goto LAB_008ef9f4;
          }
        }
        else {
          bVar2 = isLevelSampleResultValid
                            (texture->m_levels,sampler,FVar8,prec,coordX,iVar11,result);
          if (bVar2) break;
        }
      }
      else {
        iVar12 = texture->m_numLevels + -2;
        iVar10 = iVar12;
        if (iVar5 < iVar12) {
          iVar10 = iVar5;
        }
        if (iVar5 < 0) {
          iVar10 = 0;
        }
        if (iVar6 < iVar12) {
          iVar12 = iVar6;
        }
        if (iVar6 < 0) {
          iVar12 = 0;
        }
        while (iVar10 <= iVar12) {
          uVar7 = sampler->minFilter - LINEAR;
          FVar8 = NEAREST;
          if (uVar7 < 5) {
            FVar8 = *(FilterMode *)(&DAT_00a04ed0 + (ulong)uVar7 * 4);
          }
          fVar13 = (float)iVar10;
          auVar14._4_4_ = __x_00 - fVar13;
          auVar14._0_4_ = __x - fVar13;
          auVar14._8_4_ = 0.0 - fVar13;
          auVar14._12_4_ = 0.0 - fVar13;
          auVar14 = minps(_DAT_0093d9c0,auVar14);
          lVar9 = (long)iVar10;
          iVar10 = iVar10 + 1;
          local_40.m_data[1] = (float)(-(uint)(0.0 <= __x_00 - fVar13) & auVar14._4_4_);
          local_40.m_data[0] = (float)(-(uint)(0.0 <= __x - fVar13) & auVar14._0_4_);
          bVar2 = isMipmapLinearSampleResultValid
                            (texture->m_levels + lVar9,texture->m_levels + iVar10,sampler,FVar8,prec
                             ,coordX,iVar11,&local_40,result);
          if (bVar2) goto LAB_008ef9f4;
        }
      }
    }
    iVar11 = iVar11 + 1;
  }
LAB_008ef9f4:
  return iVar11 <= layerRange.m_data[1];
}

Assistant:

bool isLookupResultValid (const Texture1DArrayView& texture, const Sampler& sampler, const LookupPrecision& prec, const Vec2& coord, const Vec2& lodBounds, const Vec4& result)
{
	const IVec2		layerRange		= computeLayerRange(texture.getNumLayers(), prec.coordBits.y(), coord.y());
	const float		coordX			= coord.x();
	const float		minLod			= lodBounds.x();
	const float		maxLod			= lodBounds.y();
	const bool		canBeMagnified	= minLod <= sampler.lodThreshold;
	const bool		canBeMinified	= maxLod > sampler.lodThreshold;

	DE_ASSERT(isSamplerSupported(sampler));

	for (int layer = layerRange.x(); layer <= layerRange.y(); layer++)
	{
		if (canBeMagnified)
		{
			if (isLevelSampleResultValid(texture.getLevel(0), sampler, sampler.magFilter, prec, coordX, layer, result))
				return true;
		}

		if (canBeMinified)
		{
			const bool	isNearestMipmap	= isNearestMipmapFilter(sampler.minFilter);
			const bool	isLinearMipmap	= isLinearMipmapFilter(sampler.minFilter);
			const int	minTexLevel		= 0;
			const int	maxTexLevel		= texture.getNumLevels()-1;

			DE_ASSERT(minTexLevel <= maxTexLevel);

			if (isLinearMipmap && minTexLevel < maxTexLevel)
			{
				const int		minLevel		= de::clamp((int)deFloatFloor(minLod), minTexLevel, maxTexLevel-1);
				const int		maxLevel		= de::clamp((int)deFloatFloor(maxLod), minTexLevel, maxTexLevel-1);

				DE_ASSERT(minLevel <= maxLevel);

				for (int level = minLevel; level <= maxLevel; level++)
				{
					const float		minF	= de::clamp(minLod - float(level), 0.0f, 1.0f);
					const float		maxF	= de::clamp(maxLod - float(level), 0.0f, 1.0f);

					if (isMipmapLinearSampleResultValid(texture.getLevel(level), texture.getLevel(level+1), sampler, getLevelFilter(sampler.minFilter), prec, coordX, layer, Vec2(minF, maxF), result))
						return true;
				}
			}
			else if (isNearestMipmap)
			{
				// \note The accurate formula for nearest mipmapping is level = ceil(lod + 0.5) - 1 but Khronos has made
				//		 decision to allow floor(lod + 0.5) as well.
				const int		minLevel		= de::clamp((int)deFloatCeil(minLod + 0.5f) - 1,	minTexLevel, maxTexLevel);
				const int		maxLevel		= de::clamp((int)deFloatFloor(maxLod + 0.5f),		minTexLevel, maxTexLevel);

				DE_ASSERT(minLevel <= maxLevel);

				for (int level = minLevel; level <= maxLevel; level++)
				{
					if (isLevelSampleResultValid(texture.getLevel(level), sampler, getLevelFilter(sampler.minFilter), prec, coordX, layer, result))
						return true;
				}
			}
			else
			{
				if (isLevelSampleResultValid(texture.getLevel(0), sampler, sampler.minFilter, prec, coordX, layer, result))
					return true;
			}
		}
	}

	return false;
}